

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockRangeFactory.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::BlockRangeFactory::buildRanges(BlockRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  short *psVar1;
  short *psVar2;
  TokenFactory *this_00;
  bool bVar3;
  bool bVar4;
  RangeToken *pRVar5;
  long lVar6;
  int i;
  long lVar7;
  undefined2 *puVar8;
  
  if ((this->super_RangeFactory).fRangesCreated == false) {
    if ((this->super_RangeFactory).fKeywordsInitialized == false) {
      (*(this->super_RangeFactory)._vptr_RangeFactory[2])(this);
    }
    this_00 = rangeTokMap->fTokenFactory;
    lVar7 = 0;
    puVar8 = &fgBlockNames;
    bVar4 = false;
    bVar3 = false;
    do {
      pRVar5 = TokenFactory::createRange(this_00,false);
      (*(pRVar5->super_Token)._vptr_Token[0xc])
                (pRVar5,(ulong)(uint)(&blockRanges)[lVar7 * 2],
                 (ulong)(uint)(&DAT_0035ee74)[lVar7 * 2]);
      if (!bVar3) {
        if (lVar7 * 100 == -0x70) {
LAB_0023e582:
          (*(pRVar5->super_Token)._vptr_Token[0xc])(pRVar5,0xfff0,0xfffd);
          bVar3 = true;
        }
        else {
          lVar6 = 0;
          do {
            psVar1 = (short *)((long)puVar8 + lVar6);
            if (*psVar1 == 0) {
              if (*(short *)((long)&fgBlockIsSpecials + lVar6) == 0) goto LAB_0023e582;
              break;
            }
            psVar2 = (short *)((long)&fgBlockIsSpecials + lVar6);
            lVar6 = lVar6 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      if (!bVar4) {
        if (lVar7 * 100 == -0x50) {
LAB_0023e5d3:
          (*(pRVar5->super_Token)._vptr_Token[0xc])(pRVar5,0xf0000,0xffffd);
          (*(pRVar5->super_Token)._vptr_Token[0xc])(pRVar5,0x100000,0x10fffd);
          bVar4 = true;
        }
        else {
          lVar6 = 0;
          do {
            psVar1 = (short *)((long)puVar8 + lVar6);
            if (*psVar1 == 0) {
              if (*(short *)((long)&fgBlockIsPrivateUse + lVar6) == 0) goto LAB_0023e5d3;
              break;
            }
            psVar2 = (short *)((long)&fgBlockIsPrivateUse + lVar6);
            lVar6 = lVar6 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      if (pRVar5->fMap == (int *)0x0) {
        RangeToken::doCreateMap(pRVar5);
      }
      RangeTokenMap::setRangeToken(rangeTokMap,&fgBlockNames + lVar7 * 0x32,pRVar5,false);
      pRVar5 = RangeToken::complementRanges(pRVar5,this_00,XMLPlatformUtils::fgMemoryManager);
      if (pRVar5->fMap == (int *)0x0) {
        RangeToken::doCreateMap(pRVar5);
      }
      RangeTokenMap::setRangeToken(rangeTokMap,&fgBlockNames + lVar7 * 0x32,pRVar5,true);
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 0x32;
    } while (lVar7 != 0x5d);
    (this->super_RangeFactory).fRangesCreated = true;
  }
  return;
}

Assistant:

void BlockRangeFactory::buildRanges(RangeTokenMap *rangeTokMap) {

    if (fRangesCreated)
        return;

    if (!fKeywordsInitialized) {
        initializeKeywordMap(rangeTokMap);
    }

    TokenFactory* tokFactory = rangeTokMap->getTokenFactory();

    //for performance, once the desired specials and private use are found
    //don't need to compareString anymore
    bool foundSpecial = false;
    bool foundPrivate = false;

    for (int i=0; i < BLOCKNAMESIZE; i++) {
        RangeToken* tok = tokFactory->createRange();
        tok->addRange(blockRanges[i*2], blockRanges[(i*2)+1]);

        if (!foundSpecial && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsSpecials)) {
            tok->addRange(0xFFF0, 0xFFFD);
            foundSpecial = true;
        }
        if (!foundPrivate && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsPrivateUse)) {
            tok->addRange(0xF0000, 0xFFFFD);
            tok->addRange(0x100000, 0x10FFFD);
            foundPrivate = true;
        }

        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok);
        tok = RangeToken::complementRanges(tok, tokFactory);
        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok , true);
    }

    fRangesCreated = true;
}